

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

Regexp * __thiscall re2::Regexp::Incref(Regexp *this)

{
  mapped_type *pmVar1;
  Regexp *local_48 [3];
  Regexp *local_30;
  MutexLock local_28;
  MutexLock l;
  Regexp *this_local;
  
  if (this->ref_ < 0xfffe) {
    this->ref_ = this->ref_ + 1;
  }
  else {
    std::call_once<re2::Regexp::Incref()::__0>
              (&Incref::ref_once,(anon_class_1_0_00000001 *)((long)&l.mu_ + 7));
    MutexLock::MutexLock(&local_28,ref_mutex);
    if (this->ref_ == 0xffff) {
      local_30 = this;
      pmVar1 = std::
               map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
               ::operator[](ref_map,&local_30);
      *pmVar1 = *pmVar1 + 1;
    }
    else {
      local_48[0] = this;
      pmVar1 = std::
               map<re2::Regexp_*,_int,_std::less<re2::Regexp_*>,_std::allocator<std::pair<re2::Regexp_*const,_int>_>_>
               ::operator[](ref_map,local_48);
      *pmVar1 = 0xffff;
      this->ref_ = 0xffff;
    }
    MutexLock::~MutexLock(&local_28);
  }
  return this;
}

Assistant:

Regexp* Regexp::Incref() {
  if (ref_ >= kMaxRef-1) {
    static std::once_flag ref_once;
    std::call_once(ref_once, []() {
      ref_mutex = new Mutex;
      ref_map = new map<Regexp*, int>;
    });

    // Store ref count in overflow map.
    MutexLock l(ref_mutex);
    if (ref_ == kMaxRef) {
      // already overflowed
      (*ref_map)[this]++;
    } else {
      // overflowing now
      (*ref_map)[this] = kMaxRef;
      ref_ = kMaxRef;
    }
    return this;
  }

  ref_++;
  return this;
}